

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O2

void __thiscall
soplex::LPColSetBase<double>::add(LPColSetBase<double> *this,LPColSetBase<double> *newset)

{
  int newdim;
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  int *piVar4;
  pointer pdVar5;
  pointer pdVar6;
  int *piVar7;
  pointer pdVar8;
  long lVar9;
  long lVar10;
  
  lVar10 = (long)(this->super_SVSetBase<double>).set.thenum;
  SVSetBase<double>::add<double>(&this->super_SVSetBase<double>,&newset->super_SVSetBase<double>);
  newdim = (this->super_SVSetBase<double>).set.thenum;
  pdVar8 = (this->low).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->low).val.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar8) >> 3) < newdim)
  {
    VectorBase<double>::reDim(&this->low,newdim,true);
    VectorBase<double>::reDim(&this->up,(this->super_SVSetBase<double>).set.thenum,true);
    VectorBase<double>::reDim(&this->object,(this->super_SVSetBase<double>).set.thenum,true);
    DataArray<int>::reSize(&this->scaleExp,(this->super_SVSetBase<double>).set.thenum);
    pdVar8 = (this->low).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  pdVar1 = (newset->low).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (newset->up).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (newset->object).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (newset->scaleExp).data;
  pdVar5 = (this->up).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->object).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->scaleExp).data;
  for (lVar9 = 0; lVar10 + lVar9 < (long)(this->super_SVSetBase<double>).set.thenum;
      lVar9 = lVar9 + 1) {
    pdVar8[lVar10 + lVar9] = pdVar1[lVar9];
    pdVar5[lVar10 + lVar9] = pdVar2[lVar9];
    pdVar6[lVar10 + lVar9] = pdVar3[lVar9];
    piVar7[lVar10 + lVar9] = piVar4[lVar9];
  }
  return;
}

Assistant:

void add(const LPColSetBase<R>& newset)
   {
      int i = num();

      SVSetBase<R>::add(newset);

      if(num() > low.dim())
      {
         low.reDim(num());
         up.reDim(num());
         object.reDim(num());
         scaleExp.reSize(num());
      }

      for(int j = 0; i < num(); ++i, ++j)
      {
         low[i] = newset.lower(j);
         up[i] = newset.upper(j);
         object[i] = newset.maxObj(j);
         scaleExp[i] = newset.scaleExp[j];
      }
   }